

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Application.cpp
# Opt level: O0

void __thiscall Application::resize(Application *this)

{
  uint32_t uVar1;
  element_type *peVar2;
  element_type *peVar3;
  shared_ptr<myvk::Framebuffer> *this_00;
  vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  *this_01;
  VkExtent2D VVar4;
  element_type *peVar5;
  element_type *this_02;
  long in_RDI;
  float fVar6;
  VkExtent2D extent;
  uint32_t i;
  Ptr<ImageView> *in_stack_00000070;
  uint32_t in_stack_00000078;
  uint32_t in_stack_0000007c;
  OctreeTracer *in_stack_00000080;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint32_t local_28;
  uint32_t uStack_24;
  uint local_c;
  
  local_c = 0;
  while( true ) {
    peVar2 = std::__shared_ptr_access<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11bb24);
    myvk::FrameManager::GetSwapchain(peVar2);
    peVar3 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x11bb34);
    uVar1 = myvk::Swapchain::GetImageCount(peVar3);
    if (uVar1 <= local_c) break;
    this_00 = (shared_ptr<myvk::Framebuffer> *)(in_RDI + 0xc0);
    peVar2 = std::__shared_ptr_access<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x11bb69);
    this_01 = myvk::FrameManager::GetSwapchainImageViews(peVar2);
    std::
    vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>::
    operator[](this_01,(ulong)local_c);
    myvk::Framebuffer::Create
              ((Ptr<RenderPass> *)CONCAT44(in_stack_0000007c,in_stack_00000078),in_stack_00000070);
    std::
    vector<std::shared_ptr<myvk::Framebuffer>,_std::allocator<std::shared_ptr<myvk::Framebuffer>_>_>
    ::operator[]((vector<std::shared_ptr<myvk::Framebuffer>,_std::allocator<std::shared_ptr<myvk::Framebuffer>_>_>
                  *)(in_RDI + 0xa8),(ulong)local_c);
    std::shared_ptr<myvk::Framebuffer>::operator=
              (this_00,(shared_ptr<myvk::Framebuffer> *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    std::shared_ptr<myvk::Framebuffer>::~shared_ptr((shared_ptr<myvk::Framebuffer> *)0x11bbbf);
    local_c = local_c + 1;
  }
  peVar2 = std::__shared_ptr_access<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::FrameManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x11bbe0);
  myvk::FrameManager::GetSwapchain(peVar2);
  peVar3 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x11bbf0);
  VVar4 = myvk::Swapchain::GetExtent(peVar3);
  fVar6 = (float)((ulong)VVar4 & 0xffffffff) / (float)((ulong)VVar4 >> 0x20);
  peVar5 = std::__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Camera,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      0x11bc2a);
  peVar5->m_aspect_ratio = fVar6;
  this_02 = std::__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<PathTracerViewer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x11bc46);
  local_28 = VVar4.width;
  uStack_24 = VVar4.height;
  PathTracerViewer::Resize(this_02,local_28,uStack_24);
  std::__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<OctreeTracer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x11bc67
            );
  OctreeTracer::Resize(in_stack_00000080,in_stack_0000007c,in_stack_00000078);
  return;
}

Assistant:

void Application::resize() {
	for (uint32_t i = 0; i < m_frame_manager->GetSwapchain()->GetImageCount(); ++i) {
		m_framebuffers[i] = myvk::Framebuffer::Create(m_render_pass, m_frame_manager->GetSwapchainImageViews()[i]);
	}
	VkExtent2D extent = m_frame_manager->GetSwapchain()->GetExtent();
	m_camera->m_aspect_ratio = extent.width / float(extent.height);
	m_path_tracer_viewer->Resize(extent.width, extent.height);
	m_octree_tracer->Resize(extent.width, extent.height);
}